

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

Orphan<capnp::DynamicValue> * __thiscall
capnp::DynamicList::Builder::disown
          (Orphan<capnp::DynamicValue> *__return_storage_ptr__,Builder *this,uint index)

{
  StructBuilder other;
  Builder builder;
  ElementSize EVar1;
  Which WVar2;
  uint uVar3;
  Orphan<capnp::DynamicValue> *pOVar4;
  Orphan<capnp::DynamicStruct> *other_00;
  ListBuilder *this_00;
  Builder local_258;
  undefined1 auStack_228 [8];
  StructBuilder element;
  Orphanage local_1b8;
  undefined1 local_1a8 [8];
  Orphan<capnp::DynamicStruct> result_1;
  OrphanBuilder local_168;
  Builder local_148;
  undefined1 local_108 [8];
  Builder value;
  OrphanBuilder local_b8;
  Builder local_98;
  undefined1 local_58 [8];
  Orphan<capnp::DynamicValue> result;
  uint index_local;
  Builder *this_local;
  
  result.builder.location._4_4_ = index;
  WVar2 = ListSchema::whichElementType(&this->schema);
  uVar3 = (uint)WVar2;
  if (WVar2 < TEXT) {
LAB_002d9161:
    operator[](&local_98,this,result.builder.location._4_4_);
    _::OrphanBuilder::OrphanBuilder(&local_b8);
    Orphan<capnp::DynamicValue>::Orphan((Orphan<capnp::DynamicValue> *)local_58,&local_98,&local_b8)
    ;
    _::OrphanBuilder::~OrphanBuilder(&local_b8);
    DynamicValue::Builder::~Builder(&local_98);
    WVar2 = ListSchema::whichElementType(&this->schema);
    EVar1 = anon_unknown_70::elementSizeFor(WVar2);
    switch(EVar1) {
    case VOID:
      break;
    case BIT:
      uVar3 = bounded<unsigned_int>(result.builder.location._4_4_);
      _::ListBuilder::setDataElement<bool>(&this->builder,uVar3,false);
      break;
    case BYTE:
      uVar3 = bounded<unsigned_int>(result.builder.location._4_4_);
      _::ListBuilder::setDataElement<unsigned_char>(&this->builder,uVar3,'\0');
      break;
    case TWO_BYTES:
      uVar3 = bounded<unsigned_int>(result.builder.location._4_4_);
      _::ListBuilder::setDataElement<unsigned_short>(&this->builder,uVar3,0);
      break;
    case FOUR_BYTES:
      uVar3 = bounded<unsigned_int>(result.builder.location._4_4_);
      _::ListBuilder::setDataElement<unsigned_int>(&this->builder,uVar3,0);
      break;
    case EIGHT_BYTES:
      uVar3 = bounded<unsigned_int>(result.builder.location._4_4_);
      _::ListBuilder::setDataElement<unsigned_long>(&this->builder,uVar3,0);
      break;
    case POINTER:
    case INLINE_COMPOSITE:
      kj::_::unreachable();
    }
    pOVar4 = kj::mv<capnp::Orphan<capnp::DynamicValue>>((Orphan<capnp::DynamicValue> *)local_58);
    Orphan<capnp::DynamicValue>::Orphan(__return_storage_ptr__,pOVar4);
    Orphan<capnp::DynamicValue>::~Orphan((Orphan<capnp::DynamicValue> *)local_58);
  }
  else {
    if (2 < uVar3 - 0xc) {
      if (uVar3 == 0xf) goto LAB_002d9161;
      if (uVar3 == 0x10) {
        this_00 = &this->builder;
        builder.builder._32_8_ = this_00;
        builder._0_48_ = *(undefined1 (*) [48])&(this->schema).elementType.field_4;
        local_1b8 = Orphanage::getForMessageContaining<capnp::DynamicList::Builder>(builder);
        element._32_8_ = ListSchema::getStructElementType(&this->schema);
        Orphanage::newOrphan
                  ((Orphan<capnp::DynamicStruct> *)local_1a8,&local_1b8,(StructSchema)element._32_8_
                  );
        uVar3 = bounded<unsigned_int>(result.builder.location._4_4_);
        _::ListBuilder::getStructElement((StructBuilder *)auStack_228,this_00,uVar3);
        Orphan<capnp::DynamicStruct>::get(&local_258,(Orphan<capnp::DynamicStruct> *)local_1a8);
        other.capTable = (CapTableBuilder *)element.segment;
        other.segment = (SegmentBuilder *)auStack_228;
        other.data = element.capTable;
        other.pointers = (WirePointer *)element.data;
        other._32_8_ = element.pointers;
        _::StructBuilder::transferContentFrom(&local_258.builder,other);
        _::StructBuilder::clearAll((StructBuilder *)auStack_228);
        other_00 = kj::mv<capnp::Orphan<capnp::DynamicStruct>>
                             ((Orphan<capnp::DynamicStruct> *)local_1a8);
        Orphan<capnp::DynamicValue>::Orphan<capnp::DynamicStruct>(__return_storage_ptr__,other_00);
        Orphan<capnp::DynamicStruct>::~Orphan((Orphan<capnp::DynamicStruct> *)local_1a8);
        return __return_storage_ptr__;
      }
      if (1 < uVar3 - 0x11) {
        kj::_::unreachable();
      }
    }
    operator[]((Builder *)local_108,this,result.builder.location._4_4_);
    DynamicValue::Builder::Builder(&local_148,(Builder *)local_108);
    uVar3 = bounded<unsigned_int>(result.builder.location._4_4_);
    _::ListBuilder::getPointerElement
              ((PointerBuilder *)&result_1.builder.location,&this->builder,uVar3);
    _::PointerBuilder::disown(&local_168,(PointerBuilder *)&result_1.builder.location);
    Orphan<capnp::DynamicValue>::Orphan(__return_storage_ptr__,&local_148,&local_168);
    _::OrphanBuilder::~OrphanBuilder(&local_168);
    DynamicValue::Builder::~Builder(&local_148);
    DynamicValue::Builder::~Builder((Builder *)local_108);
  }
  return __return_storage_ptr__;
}

Assistant:

Orphan<DynamicValue> DynamicList::Builder::disown(uint index) {
  switch (schema.whichElementType()) {
    case schema::Type::VOID:
    case schema::Type::BOOL:
    case schema::Type::INT8:
    case schema::Type::INT16:
    case schema::Type::INT32:
    case schema::Type::INT64:
    case schema::Type::UINT8:
    case schema::Type::UINT16:
    case schema::Type::UINT32:
    case schema::Type::UINT64:
    case schema::Type::FLOAT32:
    case schema::Type::FLOAT64:
    case schema::Type::ENUM: {
      auto result = Orphan<DynamicValue>(operator[](index), _::OrphanBuilder());
      switch (elementSizeFor(schema.whichElementType())) {
        case ElementSize::VOID: break;
        case ElementSize::BIT: builder.setDataElement<bool>(bounded(index) * ELEMENTS, false); break;
        case ElementSize::BYTE: builder.setDataElement<uint8_t>(bounded(index) * ELEMENTS, 0); break;
        case ElementSize::TWO_BYTES: builder.setDataElement<uint16_t>(bounded(index) * ELEMENTS, 0); break;
        case ElementSize::FOUR_BYTES: builder.setDataElement<uint32_t>(bounded(index) * ELEMENTS, 0); break;
        case ElementSize::EIGHT_BYTES: builder.setDataElement<uint64_t>(bounded(index) * ELEMENTS, 0);break;

        case ElementSize::POINTER:
        case ElementSize::INLINE_COMPOSITE:
          KJ_UNREACHABLE;
      }
      return kj::mv(result);
    }

    case schema::Type::TEXT:
    case schema::Type::DATA:
    case schema::Type::LIST:
    case schema::Type::ANY_POINTER:
    case schema::Type::INTERFACE: {
      auto value = operator[](index);
      return Orphan<DynamicValue>(value, builder.getPointerElement(bounded(index) * ELEMENTS).disown());
    }

    case schema::Type::STRUCT: {
      // We have to make a copy.
      Orphan<DynamicStruct> result =
          Orphanage::getForMessageContaining(*this).newOrphan(schema.getStructElementType());
      auto element = builder.getStructElement(bounded(index) * ELEMENTS);
      result.get().builder.transferContentFrom(element);
      element.clearAll();
      return kj::mv(result);
    }
  }
  KJ_UNREACHABLE;
}